

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

void __thiscall
ktx::CommandCreate::determineTargetOrigin
          (CommandCreate *this,ImageInput *in,ImageSpec *target,Origin *usedSourceOrigin)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Origin *pOVar4;
  optional<ImageSpec::Origin> *this_00;
  
  determineSourceOrigin(this,in,usedSourceOrigin);
  (target->imageOrigin).z = usedSourceOrigin->z;
  uVar1 = usedSourceOrigin->y;
  (target->imageOrigin).x = usedSourceOrigin->x;
  (target->imageOrigin).y = uVar1;
  if ((this->options).super_OptionsCreate.convertTexcoordOrigin.
      super__Optional_base<ImageSpec::Origin,_true,_true>._M_payload.
      super__Optional_payload_base<ImageSpec::Origin>._M_engaged == true) {
    bVar2 = ImageSpec::Origin::unspecified(usedSourceOrigin);
    if (bVar2) {
      iVar3 = (*in->_vptr_ImageInput[0xd])(in);
      Reporter::fatal<char_const(&)[128],std::__cxx11::string_const&,char_const*&>
                (&(this->super_Command).super_Reporter,INVALID_FILE,
                 (char (*) [128])
                 "Cannot convert texcoord origin as no information about the origin is available in the input file \"{}\". Use --{} to specify one."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(extraout_var,iVar3),&OptionsCreate::kAssignTexcoordOrigin);
      return;
    }
    this_00 = &(this->options).super_OptionsCreate.convertTexcoordOrigin;
    pOVar4 = std::optional<ImageSpec::Origin>::value(this_00);
    bVar2 = ::operator!=(pOVar4,usedSourceOrigin);
    if (bVar2) {
      pOVar4 = std::optional<ImageSpec::Origin>::value(this_00);
      uVar1 = pOVar4->y;
      (target->imageOrigin).x = pOVar4->x;
      (target->imageOrigin).y = uVar1;
      (target->imageOrigin).z = pOVar4->z;
    }
  }
  return;
}

Assistant:

void CommandCreate::determineTargetOrigin(const ImageInput& in, ImageSpec& target,
                                          ImageSpec::Origin& usedSourceOrigin) {
    determineSourceOrigin(in, usedSourceOrigin);
    target.setOrigin(usedSourceOrigin);

    if (options.convertTexcoordOrigin.has_value()) {
        if (usedSourceOrigin.unspecified()) {
            fatal(rc::INVALID_FILE, "Cannot convert texcoord origin as no information about the origin "
                "is available in the input file \"{}\". Use --{} to specify one.",
                in.filename(), OptionsCreate::kAssignTexcoordOrigin);
        } else if (options.convertTexcoordOrigin.value() != usedSourceOrigin) {
            target.setOrigin(options.convertTexcoordOrigin.value());
        }
    }
}